

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void js_std_eval_binary(JSContext *ctx,uint8_t *buf,size_t buf_len,int load_only)

{
  int iVar1;
  int64_t extraout_RDX;
  JSValue func_val;
  JSValue JVar2;
  
  JVar2 = JS_ReadObject(ctx,buf,buf_len,1);
  if ((JVar2.tag & 0xffffffffU) != 6) {
    if (load_only == 0) {
      if ((int)JVar2.tag == -3) {
        iVar1 = JS_ResolveModule(ctx,JVar2);
        if (iVar1 < 0) {
          JS_FreeValue(ctx,JVar2);
          goto LAB_0011079c;
        }
        func_val.tag = extraout_RDX;
        func_val.u.float64 = JVar2.u.float64;
        js_module_set_import_meta(ctx,func_val,0,1);
      }
      JVar2 = JS_EvalFunction(ctx,JVar2);
      if ((uint)JVar2.tag == 6) goto LAB_0011079c;
      if ((0xfffffff4 < (uint)JVar2.tag) &&
         (iVar1 = *JVar2.u.ptr, *(int *)JVar2.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValue(ctx,JVar2);
      }
    }
    else if ((int)JVar2.tag == -3) {
      js_module_set_import_meta(ctx,JVar2,0,0);
      return;
    }
    return;
  }
LAB_0011079c:
  js_std_dump_error(ctx);
  exit(1);
}

Assistant:

void js_std_eval_binary(JSContext *ctx, const uint8_t *buf, size_t buf_len,
                        int load_only)
{
    JSValue obj, val;
    obj = JS_ReadObject(ctx, buf, buf_len, JS_READ_OBJ_BYTECODE);
    if (JS_IsException(obj))
        goto exception;
    if (load_only) {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_MODULE) {
            js_module_set_import_meta(ctx, obj, FALSE, FALSE);
        }
    } else {
        if (JS_VALUE_GET_TAG(obj) == JS_TAG_MODULE) {
            if (JS_ResolveModule(ctx, obj) < 0) {
                JS_FreeValue(ctx, obj);
                goto exception;
            }
            js_module_set_import_meta(ctx, obj, FALSE, TRUE);
        }
        val = JS_EvalFunction(ctx, obj);
        if (JS_IsException(val)) {
        exception:
            js_std_dump_error(ctx);
            exit(1);
        }
        JS_FreeValue(ctx, val);
    }
}